

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O0

void gen_assign(_node_t *node)

{
  sym_t *psVar1;
  sym_t *s;
  _node_t *in_stack_fffffffffffffff0;
  
  fprintf((FILE *)f,"; assign { \n");
  gen_expr(in_stack_fffffffffffffff0);
  psVar1 = gen_lvalue(in_stack_fffffffffffffff0);
  if (psVar1->type_id == 0x80) {
    fprintf((FILE *)f,"        ld      [de], a\n");
  }
  else {
    fprintf((FILE *)f,"        ld      [de], l\n");
    fprintf((FILE *)f,"        inc     de\n");
    fprintf((FILE *)f,"        ld      [de], h\n");
  }
  fprintf((FILE *)f,"; } assign \n");
  return;
}

Assistant:

void gen_assign(_node_t* node)
{
    sym_t* s;
    TODO("assign word");
    fprintf(f, "; assign { \n");
    gen_expr(node->children[RIGHTOP]);  /* Load byte into A or word into HL */

    s = gen_lvalue(node->children[LEFTOP]); /* Load ptr into DE */
    if (s->type_id == BYTE)
    {
        fprintf(f, "        ld      [de], a\n");
    }
    else
    {
        fprintf(f, "        ld      [de], l\n");
        fprintf(f, "        inc     de\n");
        fprintf(f, "        ld      [de], h\n");
    }

    fprintf(f, "; } assign \n");
}